

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

bool __thiscall ON_V4V5_MeshNgonUserData::CopyFrom(ON_V4V5_MeshNgonUserData *this,ON_Object *src)

{
  bool bVar1;
  ON_V4V5_MeshNgonUserData *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_V4V5_MeshNgonUserData *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf(src,&m_ON_V4V5_MeshNgonUserData_class_rtti);
    src_00 = (ON_V4V5_MeshNgonUserData *)0x0;
    if (bVar1) {
      src_00 = (ON_V4V5_MeshNgonUserData *)src;
    }
  }
  if (src_00 != (ON_V4V5_MeshNgonUserData *)0x0) {
    operator=(this,src_00);
  }
  return src_00 != (ON_V4V5_MeshNgonUserData *)0x0;
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}